

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  int local_20;
  int local_1c;
  int j_1;
  int i_1;
  int j;
  int i;
  int n;
  
  i = 0;
  __isoc99_scanf("%d",&j);
  for (i_1 = 0; i_1 < j; i_1 = i_1 + 1) {
    __isoc99_scanf("%s",stu + i_1);
    for (j_1 = 0; j_1 < 4; j_1 = j_1 + 1) {
      __isoc99_scanf("%d",(long)i_1 * 0x20 + 0x105090 + (long)j_1 * 4);
    }
  }
  std::sort<Student*,bool(*)(Student,Student)>(stu,stu + 5,cmp);
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,stu[local_1c].name);
    std::operator<<(poVar1," ");
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          *(int *)((long)local_1c * 0x20 + 0x105090 + (long)local_20 * 4));
      std::operator<<(poVar1," ");
    }
    std::operator<<((ostream *)&std::cout,"\n");
  }
  return 0;
}

Assistant:

int main() {
    int n;
    scanf("%d",&n);
    for (int i = 0; i < n; ++i) {
    scanf("%s",&stu[i].name);
        for (int j = 0; j < 4; ++j) {
            scanf("%d", &stu[i].socre[j]);
        }
    }
    sort(stu,stu+(4+1),cmp);    //尾地址要往后面走一位,因为地址0-4，一共有5个，所有尾地址填 5。
    for (int i = 0; i < 4; ++i) {
        cout << stu[i].name << " ";
        for (int j = 0; j < 4; ++j) {
            cout << stu[i].socre[j] << " ";
        }
        cout << "\n";
    }
    return 0;
}